

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Flt_t * Gia_SimQualityImpact(Gia_Man_t *p,Vec_Int_t *vPat,Vec_Int_t *vRareCounts)

{
  ulong uVar1;
  word *pwVar2;
  uint uVar3;
  uint uVar4;
  Vec_Wrd_t *pVVar5;
  int *piVar6;
  Vec_Flt_t *pVVar7;
  float *__s;
  Vec_Wrd_t *__ptr;
  word *pwVar8;
  Vec_Wrd_t *__ptr_00;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int w;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  
  uVar3 = p->vCis->nSize;
  pVVar7 = (Vec_Flt_t *)malloc(0x10);
  uVar9 = uVar3;
  if (uVar3 - 1 < 0xf) {
    uVar9 = 0x10;
  }
  pVVar7->nCap = uVar9;
  if (uVar9 == 0) {
    __s = (float *)0x0;
  }
  else {
    __s = (float *)malloc((long)(int)uVar9 << 2);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = uVar3;
  pwVar8 = (word *)0x0;
  memset(__s,0,(long)(int)uVar3 * 4);
  uVar9 = (((int)(uVar3 + 1) >> 6) + 1) - (uint)((uVar3 + 1 & 0x3f) == 0);
  iVar10 = uVar9 * uVar3;
  __ptr = (Vec_Wrd_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar12 = iVar10;
  }
  __ptr->nCap = iVar12;
  if (iVar12 != 0) {
    pwVar8 = (word *)malloc((long)iVar12 << 3);
  }
  __ptr->pArray = pwVar8;
  __ptr->nSize = iVar10;
  memset(pwVar8,0,(long)iVar10 * 8);
  if (vPat->nSize != uVar3) {
    __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x71f,"Vec_Flt_t *Gia_SimQualityImpact(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (0 < (int)uVar3) {
    lVar11 = 0;
    uVar15 = 1;
    do {
      if (iVar10 <= lVar11) goto LAB_007c925e;
      if ((0 < (int)uVar9) && (vPat->pArray[uVar15 - 1] != 0)) {
        memset(pwVar8 + lVar11,0xff,(ulong)(uVar9 * 8));
      }
      pwVar8[(uVar15 >> 6) + lVar11] = pwVar8[(uVar15 >> 6) + lVar11] ^ 1L << ((byte)uVar15 & 0x3f);
      lVar11 = lVar11 + (ulong)uVar9;
      bVar16 = uVar15 != uVar3;
      uVar15 = uVar15 + 1;
    } while (bVar16);
  }
  pVVar5 = p->vSimsPi;
  p->vSimsPi = __ptr;
  __ptr_00 = Gia_ManSimPatSim(p);
  p->vSimsPi = pVVar5;
  iVar12 = vRareCounts->nSize;
  if (iVar12 < 2) {
    pwVar8 = __ptr_00->pArray;
    if (pwVar8 == (word *)0x0) goto LAB_007c9206;
  }
  else {
    piVar6 = vRareCounts->pArray;
    lVar11 = 0;
    do {
      uVar4 = piVar6[lVar11];
      if ((int)uVar4 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar13 = (uVar4 >> 1) * uVar9;
      if (((int)uVar13 < 0) || (__ptr_00->nSize <= (int)uVar13)) {
LAB_007c925e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      iVar10 = piVar6[lVar11 + 1];
      pwVar8 = __ptr_00->pArray;
      pwVar2 = pwVar8 + uVar13;
      uVar13 = (uint)*pwVar2 & 1;
      if ((0 < (int)uVar9) && (uVar13 != 0)) {
        uVar15 = 0;
        do {
          pwVar2[uVar15] = ~pwVar2[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar9 != uVar15);
      }
      uVar15 = (ulong)p->vCis->nSize;
      if (0 < (long)uVar15) {
        fVar17 = 1.0 / (float)(iVar10 + 1);
        if (uVar13 == (uVar4 & 1)) {
          fVar17 = -fVar17;
        }
        uVar14 = 0;
        do {
          uVar1 = uVar14 + 1;
          if ((pwVar2[uVar1 >> 6 & 0x3ffffff] >> (uVar1 & 0x3f) & 1) != 0) {
            if ((long)(int)uVar3 <= (long)uVar14) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                            ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
            }
            __s[uVar14] = __s[uVar14] + fVar17;
          }
          uVar14 = uVar1;
        } while (uVar15 != uVar1);
      }
      lVar11 = lVar11 + 2;
    } while ((int)((uint)lVar11 | 1) < iVar12);
  }
  free(pwVar8);
LAB_007c9206:
  free(__ptr_00);
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return pVVar7;
}

Assistant:

Vec_Flt_t * Gia_SimQualityImpact( Gia_Man_t * p, Vec_Int_t * vPat, Vec_Int_t * vRareCounts )
{
    Vec_Flt_t * vQuoIncs = Vec_FltStart( Gia_ManCiNum(p) );
    int nWordsNew = Abc_Bit6WordNum( 1+Gia_ManCiNum(p) );
    Vec_Wrd_t * vSimsPiNew = Vec_WrdStart( Gia_ManCiNum(p) * nWordsNew );
    Vec_Wrd_t * vTemp, * vSims;
    int i, k, Value, RareLit, RareCount;
    assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );
    Vec_IntForEachEntry( vPat, Value, i )
    {
        word * pSim = Vec_WrdEntryP( vSimsPiNew, i*nWordsNew );
        if ( Value )
            Abc_TtFill( pSim, nWordsNew );
        Abc_TtXorBit( pSim, i+1 );
    }
    vTemp = p->vSimsPi;
    p->vSimsPi = vSimsPiNew;
    vSims = Gia_ManSimPatSim( p );
    p->vSimsPi = vTemp;
    Vec_IntForEachEntryDouble( vRareCounts, RareLit, RareCount, i )
    {
        float Incrm = (float)1.0/(RareCount+1);
        int RareObj = Abc_Lit2Var(RareLit);
        int RareVal = Abc_LitIsCompl(RareLit);
        word * pSim = Vec_WrdEntryP( vSims, RareObj*nWordsNew );
        int OrigVal = pSim[0] & 1;
        if ( OrigVal )
            Abc_TtNot( pSim, nWordsNew );
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            if ( Abc_TtGetBit(pSim, k+1) ) // value changed
                Vec_FltAddToEntry( vQuoIncs, k, OrigVal != RareVal ? Incrm : -Incrm );
    }
    Vec_WrdFree( vSims );
    Vec_WrdFree( vSimsPiNew );
    return vQuoIncs;
}